

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.h
# Opt level: O2

void __thiscall HighsLp::HighsLp(HighsLp *this,HighsLp *param_1)

{
  double dVar1;
  HighsInt HVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined2 uVar5;
  
  HVar2 = param_1->num_row_;
  this->num_col_ = param_1->num_col_;
  this->num_row_ = HVar2;
  std::vector<double,_std::allocator<double>_>::vector(&this->col_cost_,&param_1->col_cost_);
  std::vector<double,_std::allocator<double>_>::vector(&this->col_lower_,&param_1->col_lower_);
  std::vector<double,_std::allocator<double>_>::vector(&this->col_upper_,&param_1->col_upper_);
  std::vector<double,_std::allocator<double>_>::vector(&this->row_lower_,&param_1->row_lower_);
  std::vector<double,_std::allocator<double>_>::vector(&this->row_upper_,&param_1->row_upper_);
  HighsSparseMatrix::HighsSparseMatrix(&this->a_matrix_,&param_1->a_matrix_);
  uVar3 = *(undefined4 *)&param_1->field_0xf4;
  dVar1 = param_1->offset_;
  this->sense_ = param_1->sense_;
  *(undefined4 *)&this->field_0xf4 = uVar3;
  this->offset_ = dVar1;
  std::__cxx11::string::string((string *)&this->model_name_,(string *)&param_1->model_name_);
  std::__cxx11::string::string((string *)&this->objective_name_,(string *)&param_1->objective_name_)
  ;
  HVar2 = param_1->new_row_name_ix_;
  this->new_col_name_ix_ = param_1->new_col_name_ix_;
  this->new_row_name_ix_ = HVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->col_names_,&param_1->col_names_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->row_names_,&param_1->row_names_);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            (&this->integrality_,&param_1->integrality_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&this->col_hash_,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&param_1->col_hash_);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&this->row_hash_,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&param_1->row_hash_);
  HVar2 = param_1->user_cost_scale_;
  this->user_bound_scale_ = param_1->user_bound_scale_;
  this->user_cost_scale_ = HVar2;
  HighsScale::HighsScale(&this->scale_,&param_1->scale_);
  this->has_infinite_cost_ = param_1->has_infinite_cost_;
  bVar4 = param_1->is_moved_;
  uVar5 = *(undefined2 *)&param_1->field_0x252;
  HVar2 = param_1->cost_row_location_;
  this->is_scaled_ = param_1->is_scaled_;
  this->is_moved_ = bVar4;
  *(undefined2 *)&this->field_0x252 = uVar5;
  this->cost_row_location_ = HVar2;
  HighsLpMods::HighsLpMods(&this->mods_,&param_1->mods_);
  return;
}

Assistant:

HighsLp() { clear(); }